

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void run_container_andnot(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  rle16_t *prVar1;
  rle16_t *prVar2;
  rle16_t *prVar3;
  bool bVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  iVar10 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar10) {
    run_container_grow(dst,iVar10,false);
  }
  dst->n_runs = 0;
  bVar4 = 0 < src_1->n_runs;
  if (0 < src_1->n_runs) {
    prVar1 = src_1->runs;
    uVar7 = (uint)prVar1->value;
    uVar9 = (uint)prVar1->length + (uint)prVar1->value + 1;
    iVar10 = src_2->n_runs;
    if (iVar10 < 1) {
      uVar14 = 0;
    }
    else {
      prVar2 = src_2->runs;
      uVar11 = (uint)prVar2->value;
      uVar13 = (uint)prVar2->value + (uint)prVar2->length + 1;
      iVar8 = 0;
      uVar14 = 0;
      do {
        uVar6 = (ushort)uVar7;
        uVar5 = uVar7;
        if (uVar11 < uVar9) {
          if (uVar7 < uVar13) {
            if (uVar7 < uVar11) {
              prVar3 = dst->runs;
              iVar10 = dst->n_runs;
              dst->n_runs = iVar10 + 1;
              prVar3[iVar10].value = uVar6;
              prVar3[iVar10].length = ~uVar6 + (short)uVar11;
            }
            uVar5 = uVar13;
            if (uVar9 <= uVar13) goto LAB_00120460;
          }
          else {
            iVar8 = iVar8 + 1;
            if (iVar8 < iVar10) {
              uVar11 = (uint)prVar2[iVar8].value;
              uVar13 = prVar2[iVar8].length + uVar11 + 1;
            }
          }
        }
        else {
          prVar3 = dst->runs;
          iVar10 = dst->n_runs;
          dst->n_runs = iVar10 + 1;
          prVar3[iVar10].value = uVar6;
          prVar3[iVar10].length = ~uVar6 + (short)uVar9;
LAB_00120460:
          uVar14 = uVar14 + 1;
          uVar5 = uVar7;
          if ((int)uVar14 < src_1->n_runs) {
            uVar9 = (uint)prVar1[(int)uVar14].length + (uint)prVar1[(int)uVar14].value + 1;
            uVar5 = (uint)prVar1[(int)uVar14].value;
          }
        }
        uVar7 = uVar5;
        bVar4 = (int)uVar14 < src_1->n_runs;
        if (src_1->n_runs <= (int)uVar14) {
          return;
        }
        iVar10 = src_2->n_runs;
      } while (iVar8 < iVar10);
    }
    if (bVar4) {
      prVar2 = dst->runs;
      lVar12 = (long)dst->n_runs;
      dst->n_runs = (int32_t)(lVar12 + 1);
      prVar2[lVar12].value = (ushort)uVar7;
      prVar2[lVar12].length = (short)uVar9 + ~(ushort)uVar7;
      iVar10 = uVar14 + 1;
      iVar8 = src_1->n_runs - iVar10;
      if (iVar8 != 0 && iVar10 <= src_1->n_runs) {
        memcpy(prVar2 + lVar12 + 1,prVar1 + iVar10,(long)iVar8 << 2);
        dst->n_runs = dst->n_runs + ~uVar14 + src_1->n_runs;
      }
    }
  }
  return;
}

Assistant:

void run_container_andnot(const run_container_t *src_1,
                          const run_container_t *src_2, run_container_t *dst) {
    // following Java implementation as of June 2016

    if (dst->capacity < src_1->n_runs + src_2->n_runs)
        run_container_grow(dst, src_1->n_runs + src_2->n_runs, false);

    dst->n_runs = 0;

    int rlepos1 = 0;
    int rlepos2 = 0;
    int32_t start = src_1->runs[rlepos1].value;
    int32_t end = start + src_1->runs[rlepos1].length + 1;
    int32_t start2 = src_2->runs[rlepos2].value;
    int32_t end2 = start2 + src_2->runs[rlepos2].length + 1;

    while ((rlepos1 < src_1->n_runs) && (rlepos2 < src_2->n_runs)) {
        if (end <= start2) {
            // output the first run
            dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos1++;
            if (rlepos1 < src_1->n_runs) {
                start = src_1->runs[rlepos1].value;
                end = start + src_1->runs[rlepos1].length + 1;
            }
        } else if (end2 <= start) {
            // exit the second run
            rlepos2++;
            if (rlepos2 < src_2->n_runs) {
                start2 = src_2->runs[rlepos2].value;
                end2 = start2 + src_2->runs[rlepos2].length + 1;
            }
        } else {
            if (start < start2) {
                dst->runs[dst->n_runs++] =
                    MAKE_RLE16(start, start2 - start - 1);
            }
            if (end2 < end) {
                start = end2;
            } else {
                rlepos1++;
                if (rlepos1 < src_1->n_runs) {
                    start = src_1->runs[rlepos1].value;
                    end = start + src_1->runs[rlepos1].length + 1;
                }
            }
        }
    }
    if (rlepos1 < src_1->n_runs) {
        dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
        rlepos1++;
        if (rlepos1 < src_1->n_runs) {
            memcpy(dst->runs + dst->n_runs, src_1->runs + rlepos1,
                   sizeof(rle16_t) * (src_1->n_runs - rlepos1));
            dst->n_runs += src_1->n_runs - rlepos1;
        }
    }
}